

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O3

DWARFFormValue *
llvm::DWARFFormValue::createFromUnit
          (DWARFFormValue *__return_storage_ptr__,Form F,DWARFUnit *U,uint64_t *OffsetPtr)

{
  DWARFDataExtractor local_50;
  
  __return_storage_ptr__->Form = F;
  (__return_storage_ptr__->Value).field_0.uval = 0;
  (__return_storage_ptr__->Value).data = (uint8_t *)0x0;
  __return_storage_ptr__->U = (DWARFUnit *)0x0;
  __return_storage_ptr__->C = (DWARFContext *)0x0;
  DWARFUnit::getDebugInfoExtractor(&local_50,U);
  extractValue(__return_storage_ptr__,&local_50,OffsetPtr,(U->Header).FormParams,(DWARFContext *)0x0
               ,U);
  return __return_storage_ptr__;
}

Assistant:

DWARFFormValue DWARFFormValue::createFromUnit(dwarf::Form F, const DWARFUnit *U,
                                              uint64_t *OffsetPtr) {
  DWARFFormValue FormValue(F);
  FormValue.extractValue(U->getDebugInfoExtractor(), OffsetPtr,
                         U->getFormParams(), U);
  return FormValue;
}